

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O2

void __thiscall CCoinsViewDB::ResizeCache(CCoinsViewDB *this,size_t new_cache_size)

{
  _Alloc_hider __p;
  long in_FS_OFFSET;
  _Alloc_hider local_30;
  size_type local_28;
  
  local_28 = *(size_type *)(in_FS_OFFSET + 0x28);
  if ((this->m_db_params).memory_only == false) {
    std::__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>::reset
              ((__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_> *)&this->m_db,
               (pointer)0x0);
    (this->m_db_params).cache_bytes = new_cache_size;
    (this->m_db_params).wipe_data = false;
    std::make_unique<CDBWrapper,DBParams&>((DBParams *)&stack0xffffffffffffffd0);
    __p._M_p = local_30._M_p;
    local_30._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>::reset
              ((__uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_> *)&this->m_db,
               (pointer)__p._M_p);
    std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::~unique_ptr
              ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)&stack0xffffffffffffffd0)
    ;
  }
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCoinsViewDB::ResizeCache(size_t new_cache_size)
{
    // We can't do this operation with an in-memory DB since we'll lose all the coins upon
    // reset.
    if (!m_db_params.memory_only) {
        // Have to do a reset first to get the original `m_db` state to release its
        // filesystem lock.
        m_db.reset();
        m_db_params.cache_bytes = new_cache_size;
        m_db_params.wipe_data = false;
        m_db = std::make_unique<CDBWrapper>(m_db_params);
    }
}